

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O1

void __thiscall llvm::yaml::Input::~Input(Input *this)

{
  HNode *pHVar1;
  
  (this->super_IO)._vptr_IO = (_func_int **)&PTR__Input_01099980;
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>);
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::~BumpPtrAllocatorImpl
            (&this->StringAllocator);
  pHVar1 = (this->TopNode)._M_t.
           super___uniq_ptr_impl<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
           ._M_t.
           super__Tuple_impl<0UL,_llvm::yaml::Input::HNode_*,_std::default_delete<llvm::yaml::Input::HNode>_>
           .super__Head_base<0UL,_llvm::yaml::Input::HNode_*,_false>._M_head_impl;
  if (pHVar1 != (HNode *)0x0) {
    (*pHVar1->_vptr_HNode[2])();
  }
  (this->TopNode)._M_t.
  super___uniq_ptr_impl<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>.
  _M_t.
  super__Tuple_impl<0UL,_llvm::yaml::Input::HNode_*,_std::default_delete<llvm::yaml::Input::HNode>_>
  .super__Head_base<0UL,_llvm::yaml::Input::HNode_*,_false>._M_head_impl = (HNode *)0x0;
  std::unique_ptr<llvm::yaml::Stream,_std::default_delete<llvm::yaml::Stream>_>::~unique_ptr
            (&this->Strm);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->SrcMgr).IncludeDirectories);
  std::vector<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>::~vector
            (&(this->SrcMgr).Buffers);
  return;
}

Assistant:

Input::~Input() = default;